

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::BVHLoader::CanRead(BVHLoader *this,string *pFile,IOSystem *pIOHandler,bool cs)

{
  bool bVar1;
  bool bVar2;
  char *tokens [1];
  string extension;
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"bvh");
  bVar2 = true;
  if (bVar1) goto LAB_003e396f;
  if (extension._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_003e3942;
  }
  else if (pIOHandler != (IOSystem *)0x0 && cs) {
LAB_003e3942:
    tokens[0] = "HIERARCHY";
    bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,200,false,false);
    goto LAB_003e396f;
  }
  bVar2 = false;
LAB_003e396f:
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool BVHLoader::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool cs) const
{
    // check file extension
    const std::string extension = GetExtension(pFile);

    if( extension == "bvh")
        return true;

    if ((!extension.length() || cs) && pIOHandler) {
        const char* tokens[] = {"HIERARCHY"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}